

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O1

StreamSep * __thiscall Hpipe::StreamSep::operator<<(StreamSep *this,char **val)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->stream,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
  __s = *val;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  return this;
}

Assistant:

StreamSep &operator<<( const T &val ) {
        *stream << sep << val;
        return *this;
    }